

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

CharItem * __thiscall
Hpipe::Pool<Hpipe::CharItem,_32>::New<Hpipe::Cond>(Pool<Hpipe::CharItem,_32> *this,Cond *args)

{
  Set *pSVar1;
  int iVar2;
  Cond CStack_38;
  
  iVar2 = this->used;
  if (iVar2 == 0x20) {
    pSVar1 = (Set *)operator_new(0x1108);
    pSVar1->prev = this->last;
    this->last = pSVar1;
    iVar2 = 0;
  }
  else {
    pSVar1 = this->last;
  }
  this->used = iVar2 + 1;
  Cond::Cond(&CStack_38,args);
  CharItem::CharItem((CharItem *)(pSVar1->items + (long)iVar2 * 0x88),&CStack_38);
  return (CharItem *)(pSVar1->items + (long)iVar2 * 0x88);
}

Assistant:

T *New( Args&&... args ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        return new ( last->items + sizeof( T ) * used++ ) T( std::forward<Args>( args )... );
    }